

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_data_collection_scanner.cpp
# Opt level: O1

void __thiscall
duckdb::RowDataCollectionScanner::RowDataCollectionScanner
          (RowDataCollectionScanner *this,RowDataCollection *rows_p,RowDataCollection *heap_p,
          RowLayout *layout_p,bool external_p,idx_t block_idx,bool flush_p)

{
  unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true> *puVar1;
  undefined7 uVar2;
  byte bVar3;
  long lVar4;
  pointer pRVar5;
  unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true> *this_00;
  long lVar6;
  idx_t iVar7;
  LogicalType local_48;
  
  this->rows = rows_p;
  this->heap = heap_p;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&this->layout,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)layout_p);
  (this->layout).row_width = layout_p->row_width;
  iVar7 = layout_p->data_width;
  (this->layout).flag_width = layout_p->flag_width;
  (this->layout).data_width = iVar7;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&(this->layout).offsets,
             &(layout_p->offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  uVar2 = *(undefined7 *)&layout_p->field_0x49;
  iVar7 = layout_p->heap_pointer_offset;
  (this->layout).all_constant = layout_p->all_constant;
  *(undefined7 *)&(this->layout).field_0x49 = uVar2;
  (this->layout).heap_pointer_offset = iVar7;
  ScanState::ScanState(&this->read_state,this);
  this->total_count = this->rows->count;
  this->total_scanned = 0;
  LogicalType::LogicalType(&local_48,POINTER);
  Vector::Vector(&this->addresses,&local_48,0x800);
  LogicalType::~LogicalType(&local_48);
  this->external = external_p;
  this->flush = flush_p;
  bVar3 = false;
  if ((external_p) && (bVar3 = false, (this->layout).all_constant == false)) {
    bVar3 = this->heap->keep_pinned ^ 1;
  }
  this->unswizzling = (bool)bVar3;
  (this->read_state).block_idx = block_idx;
  (this->read_state).entry_idx = 0;
  puVar1 = (this->rows->blocks).
           super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(block_idx);
  if (lVar4 == 0) {
    iVar7 = 0;
  }
  else {
    lVar6 = lVar4 * 8;
    iVar7 = 0;
    this_00 = puVar1;
    do {
      pRVar5 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
               operator->(this_00);
      iVar7 = iVar7 + pRVar5->count;
      this_00 = this_00 + 1;
      lVar6 = lVar6 + -8;
    } while (lVar6 != 0);
  }
  this->total_scanned = iVar7;
  pRVar5 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
           operator->(puVar1 + lVar4);
  this->total_count = iVar7 + pRVar5->count;
  return;
}

Assistant:

RowDataCollectionScanner::RowDataCollectionScanner(RowDataCollection &rows_p, RowDataCollection &heap_p,
                                                   const RowLayout &layout_p, bool external_p, idx_t block_idx,
                                                   bool flush_p)
    : rows(rows_p), heap(heap_p), layout(layout_p), read_state(*this), total_count(rows.count), total_scanned(0),
      external(external_p), flush(flush_p), unswizzling(!layout.AllConstant() && external && !heap.keep_pinned) {

	if (unswizzling) {
		D_ASSERT(rows.blocks.size() == heap.blocks.size());
	}

	D_ASSERT(block_idx < rows.blocks.size());
	read_state.block_idx = block_idx;
	read_state.entry_idx = 0;

	//	Pretend that we have scanned up to the start block
	//	and will stop at the end
	auto begin = rows.blocks.begin();
	auto end = begin + NumericCast<int64_t>(block_idx);
	total_scanned =
	    std::accumulate(begin, end, idx_t(0), [&](idx_t c, const unique_ptr<RowDataBlock> &b) { return c + b->count; });
	total_count = total_scanned + (*end)->count;

	ValidateUnscannedBlock();
}